

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

int __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
::size(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>
          ::size(&this->left_->fadexpr_);
  iVar1 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar2 <= iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }